

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O2

int adios2::utils::readVar<long>(Engine *fp,IO *io,Variable<long> *variable)

{
  unsigned_long uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  size_type __new_size;
  ostream *poVar11;
  pointer puVar12;
  int iVar13;
  pointer puVar14;
  ulong uVar15;
  size_t relstep;
  long lVar16;
  ulong uVar17;
  char *pcVar18;
  uint64_t uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  bool bVar26;
  ulong local_448;
  byte local_420;
  Dims shape;
  Dims dimsign;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_3b8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_398;
  vector<long,_std::allocator<long>_> dataV;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_350;
  uint64_t c [16];
  uint64_t s [16];
  uint64_t count_t [16];
  uint64_t readn [16];
  uint64_t start_t [16];
  int ndigits_dims [32];
  
  dataV.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dataV.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  dataV.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  uVar9 = *(ulong *)(variable + 0x30);
  if (timestep == 0) {
    uVar23 = adios2::core::VariableBase::GetAvailableStepsCount();
  }
  else {
    uVar23 = 1;
  }
  bVar4 = timestep;
  lVar24 = *(long *)(variable + 0x60);
  lVar16 = *(long *)(variable + 0x58);
  uVar6 = (uint)uVar23;
  bVar2 = (int)uVar6 < 2;
  local_420 = bVar2 | timestep;
  if (bVar2 || (timestep & 1) != 0) {
    relstep = 0;
    local_448 = 1;
    uVar20 = 0;
  }
  else {
    relstep = (ulong)((uint)(istart >> 0x3f) & uVar6) + istart;
    local_448 = (((uVar23 & 0xffffffff) + icount) - relstep) + 1;
    if (-1 < (long)icount) {
      local_448 = icount;
    }
    if (2 < verbose) {
      printf("    j=0, stepStart=%lu stepCount=%lu\n",relstep,local_448);
    }
    if ((uVar23 & 0xffffffff) < local_448 + relstep) {
      printf("ERROR: The sum of start step (%lu) and step count (%lu) is larger than the number of steps available (%d)\n"
             ,relstep,local_448,uVar23);
      iVar13 = -1;
      goto LAB_00133e15;
    }
    count_t[0] = local_448;
    start_t[0] = relstep;
    uVar20 = 1;
    if (1 < verbose) {
      printf("    s[0]=%lu, c[0]=%lu, n=%lu\n",relstep,local_448,local_448);
      uVar20 = 1;
    }
  }
  sVar8 = relative_to_absolute_step<long>(fp,variable,relstep);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (timestep == 1) {
    adios2::core::VariableBase::Shape((ulong)&dimsign);
  }
  else {
    adios2::core::VariableBase::Shape((ulong)&dimsign);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&shape,&dimsign.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&dimsign.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  uVar23 = (ulong)(lVar24 - lVar16) >> 3;
  if (2 < verbose) {
    printf("    starting step=%lu absolute step=%zu, dims={",relstep,sVar8);
    puVar12 = shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (puVar14 = shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start; puVar14 != puVar12; puVar14 = puVar14 + 1) {
      printf("%zu",*puVar14);
    }
    puts("}");
  }
  iVar13 = (int)uVar23;
  if (bVar2 || (bVar4 & 1) != 0) {
LAB_001335b9:
    local_420 = local_420 ^ 1;
    uVar6 = uVar20 + iVar13;
    uVar15 = 0;
    if (0 < iVar13) {
      uVar15 = uVar23 & 0xffffffff;
    }
    uVar23 = (ulong)(uVar20 * 8);
    for (lVar24 = 0; uVar15 * 8 != lVar24; lVar24 = lVar24 + 8) {
      lVar16 = *(long *)((long)&istart + lVar24 + uVar23);
      if (lVar16 < 0) {
        lVar16 = lVar16 + *(long *)((long)shape.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar24);
      }
      lVar22 = *(long *)((long)&icount + lVar24 + uVar23);
      if (lVar22 < 0) {
        lVar22 = (lVar22 - lVar16) +
                 *(long *)((long)shape.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar24) + 1;
      }
      if (2 < verbose) {
        printf("    j=%d, st=%lu ct=%lu\n",(ulong)uVar20,lVar16,lVar22);
      }
      iVar7 = verbose;
      *(long *)((long)start_t + lVar24 + uVar23) = lVar16;
      *(long *)((long)count_t + lVar24 + uVar23) = lVar22;
      local_448 = local_448 * lVar22;
      if (1 < iVar7) {
        printf("    s[%d]=%lu, c[%d]=%lu, n=%lu\n",(ulong)uVar20,lVar16,(ulong)uVar20,lVar22,
               local_448);
      }
      uVar20 = uVar20 + 1;
    }
    if (1 < verbose) {
      printf(" total size of data to read = %lu\n",local_448 * uVar9);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_350,&shape);
    print_slice_info((VariableBase *)variable,(bool)(local_420 & 1),start_t,count_t,
                     (Dims *)&local_350);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_350);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar9;
    uVar9 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xa00000)) / auVar3,0);
    if (local_448 < uVar9) {
      uVar9 = local_448;
    }
    std::__cxx11::string::string((string *)&dimsign,".xml",(allocator *)&local_3b8);
    cVar5 = adios2::helper::EndsWith((string *)(variable + 8),(string *)&dimsign,false);
    std::__cxx11::string::~string((string *)&dimsign);
    if (cVar5 != '\0') {
      uVar9 = local_448;
    }
    if (1 < verbose) {
      puts("Read size strategy:");
    }
    uVar23 = 1;
    uVar21 = uVar23;
    for (uVar20 = uVar6 - 1; uVar17 = (ulong)uVar20, -1 < (int)uVar20; uVar20 = uVar20 - 1) {
      if (uVar21 < uVar9) {
        uVar10 = uVar9 / (ulong)(long)(int)uVar21;
        uVar25 = count_t[uVar17];
        if (uVar10 < count_t[uVar17]) {
          uVar25 = uVar10;
        }
        readn[uVar17] = uVar25;
      }
      else {
        readn[uVar17] = 1;
        uVar25 = 1;
      }
      if (1 < verbose) {
        printf("    dim %d: read %lu elements\n",uVar17,uVar25);
      }
      uVar21 = uVar21 * count_t[uVar17];
      uVar23 = uVar23 * uVar25;
    }
    if (1 < verbose) {
      printf("    read %lu elements at once, %lu in total (nelems=%lu)\n",uVar23,uVar21,local_448);
    }
    uVar23 = 0;
    uVar9 = 0;
    if (0 < (int)uVar6) {
      uVar9 = (ulong)uVar6;
    }
    for (; (uint)((int)uVar9 * 2) != uVar23; uVar23 = uVar23 + 2) {
      lVar24 = *(long *)(ndigits_dims + (uVar23 - 0x20));
      *(long *)((long)s + uVar23 * 4) = lVar24;
      *(undefined8 *)((long)c + uVar23 * 4) = *(undefined8 *)((long)readn + uVar23 * 4);
      iVar7 = ndigits((lVar24 + *(long *)((long)count_t + uVar23 * 4)) - 1);
      *(int *)((long)ndigits_dims + uVar23 * 2) = iVar7;
    }
    lVar24 = uVar9 * 8;
    for (uVar9 = 0; uVar9 < local_448; uVar9 = uVar9 + lVar16) {
      lVar16 = 1;
      for (lVar22 = 0; lVar24 - lVar22 != 0; lVar22 = lVar22 + 8) {
        lVar16 = lVar16 * *(long *)((long)c + lVar22);
      }
      if (2 < verbose) {
        printf("adios_read_var name=%s ",*(undefined8 *)(variable + 8));
        printf("%s = { ","  start");
        for (lVar22 = 0; lVar24 - lVar22 != 0; lVar22 = lVar22 + 8) {
          printf("%lu ",*(undefined8 *)((long)s + lVar22));
        }
        putchar(0x7d);
        printf("%s = { ","  count");
        for (lVar22 = 0; lVar24 - lVar22 != 0; lVar22 = lVar22 + 8) {
          printf("%lu ",*(undefined8 *)((long)c + lVar22));
        }
        putchar(0x7d);
        printf("  read %lu elems\n",lVar16);
      }
      if (*(int *)(variable + 0x40) == 2) {
        adios2::helper::Uint64ArrayToSizetVector((ulong)&local_3b8,(ulong *)(long)iVar13);
        if (*(int *)(variable + 0x40) != 2) goto LAB_00133a4c;
        adios2::helper::Uint64ArrayToSizetVector((ulong)&local_398,(ulong *)(long)iVar13);
      }
      else {
        local_3b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_00133a4c:
        local_398._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_398._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_398._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      if (2 < verbose) {
        printf("set selection: ");
        printf("%s = { ","  start");
        for (uVar23 = 0; uVar15 != uVar23; uVar23 = uVar23 + 1) {
          printf("%zu ",local_3b8._M_impl.super__Vector_impl_data._M_start[uVar23]);
        }
        putchar(0x7d);
        printf("%s = { ","  count");
        for (uVar23 = 0; uVar15 != uVar23; uVar23 = uVar23 + 1) {
          printf("%zu ",local_398._M_impl.super__Vector_impl_data._M_start[uVar23]);
        }
        putchar(0x7d);
        putchar(10);
      }
      if (*(int *)(variable + 0x40) == 2) {
        std::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
                  ((pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)&dimsign,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3b8,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_398);
        adios2::core::VariableBase::SetSelection((pair *)variable);
        std::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::~pair((pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 *)&dimsign);
      }
      if (!bVar2 && (bVar4 & 1) == 0) {
        if (2 < verbose) {
          printf("set Step selection: from relative step %lu read %lu steps\n",s[0],c[0]);
        }
        dimsign.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)s[0];
        dimsign.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)c[0];
        adios2::core::VariableBase::SetStepSelection((pair *)variable);
      }
      __new_size = adios2::core::Variable<long>::SelectionSize();
      std::vector<long,_std::allocator<long>_>::resize(&dataV,__new_size);
      adios2::core::Engine::Get<long>((Variable *)fp,variable,(Mode)&dataV);
      print_dataset(dataV.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,*(DataType *)(variable + 0x28),s,c,uVar6,
                    ndigits_dims);
      bVar26 = true;
      for (uVar20 = uVar6 - 1; -1 < (int)uVar20; uVar20 = uVar20 - 1) {
        if (bVar26) {
          uVar23 = count_t[uVar20] + start_t[uVar20];
          bVar26 = c[uVar20] + s[uVar20] == uVar23;
          if (bVar26) {
            s[uVar20] = start_t[uVar20];
            uVar19 = readn[uVar20];
          }
          else {
            uVar19 = s[uVar20] + readn[uVar20];
            s[uVar20] = uVar19;
            if (c[uVar20] + uVar19 <= uVar23) goto LAB_00133c7e;
            uVar19 = uVar23 - uVar19;
          }
          c[uVar20] = uVar19;
        }
        else {
LAB_00133c7e:
          bVar26 = false;
        }
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_398);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_3b8);
    }
    print_endline();
    iVar13 = 0;
    if (accuracyWasSet == '\x01') {
      adios2::core::VariableBase::GetAccuracy();
      std::operator<<((ostream *)&std::cout,"Read accuracy was (error = ");
      poVar11 = std::ostream::_M_insert<double>
                          ((double)dimsign.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
      std::operator<<(poVar11,", norm = ");
      poVar11 = std::ostream::_M_insert<double>
                          ((double)dimsign.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
      poVar11 = std::operator<<(poVar11,", ");
      pcVar18 = "abs";
      if ((char)dimsign.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage != '\0') {
        pcVar18 = "rel";
      }
      poVar11 = std::operator<<(poVar11,pcVar18);
      std::operator<<(poVar11,")\n");
    }
  }
  else {
    get_global_array_signature<long>(&dimsign,fp,io,variable);
    puVar12 = dimsign.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      if (puVar12 ==
          dimsign.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_001335ac;
      uVar1 = *puVar12;
      puVar12 = puVar12 + 1;
    } while (uVar1 != 0);
    if (local_448 < 2) {
LAB_001335ac:
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&dimsign.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      goto LAB_001335b9;
    }
    puts(
        "ERROR: This variable has a changing shape over time, so bpls cannot dump it as a global array. "
        );
    printf("You can dump a single step with\n    bpls -d %s -s \"T",*(undefined8 *)(variable + 8));
    uVar15 = 0;
    uVar9 = uVar15;
    if (0 < iVar13) {
      uVar15 = uVar23 & 0xffffffff;
      uVar9 = uVar15;
    }
    while (iVar13 = (int)uVar15, uVar15 = (ulong)(iVar13 - 1), iVar13 != 0) {
      printf(",0");
    }
    printf("\" -c \"1");
    while (iVar13 = (int)uVar9, uVar9 = (ulong)(iVar13 - 1), iVar13 != 0) {
      printf(",-1");
    }
    printf("\"\nwhere T is a number between 0 and %d,\n",(ulong)(uVar6 - 1));
    printf("or dump each block separately with \n    bpls -dD %s\n",*(undefined8 *)(variable + 8));
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&dimsign.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    iVar13 = -1;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_00133e15:
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&dataV.super__Vector_base<long,_std::allocator<long>_>);
  return iVar13;
}

Assistant:

int readVar(core::Engine *fp, core::IO *io, core::Variable<T> *variable)
{
    int i, j;
    uint64_t start_t[MAX_DIMS],
        count_t[MAX_DIMS]; // processed <0 values in start/count
    uint64_t s[MAX_DIMS],
        c[MAX_DIMS]; // for block reading of smaller chunks
    int tdims;       // number of dimensions including time
    int tidx;        // 0 or 1 to account for time dimension
    uint64_t nelems; // number of elements to read
    // size_t elemsize;                   // size in bytes of one element
    uint64_t stepStart, stepCount;
    std::vector<T> dataV;
    uint64_t sum;             // working var to sum up things
    uint64_t maxreadn;        // max number of elements to read once up to a limit
                              // (10MB of data)
    uint64_t actualreadn;     // our decision how much to read at once
    uint64_t readn[MAX_DIMS]; // how big chunk to read in in each dimension?
    int ndigits_dims[32];     // # of digits (to print) of each dimension

    const size_t elemsize = variable->m_ElementSize;
    const int nsteps = (timestep ? 1 : static_cast<int>(variable->GetAvailableStepsCount()));
    const int ndim = static_cast<int>(variable->m_Shape.size());
    // create the counter arrays with the appropriate lengths
    // transfer start and count arrays to format dependent arrays

    nelems = 1;
    tidx = 0;
    stepStart = 0;
    stepCount = 1;

    if (!timestep && nsteps > 1)
    {
        // user selection must start with step selection
        // calculate the starting step and number of steps requested
        if (istart[0] < 0) // negative index means last-|index|
            stepStart = nsteps + istart[0];
        else
            stepStart = istart[0];
        if (icount[0] < 0) // negative index means last-|index|+1-start
            stepCount = nsteps + icount[0] + 1 - stepStart;
        else
            stepCount = icount[0];

        if (verbose > 2)
            printf("    j=0, stepStart=%" PRIu64 " stepCount=%" PRIu64 "\n", stepStart, stepCount);

        if (stepStart + stepCount > static_cast<uint64_t>(nsteps))
        {
            printf("ERROR: The sum of start step (%" PRIu64 ") and step count (%" PRIu64
                   ") is larger "
                   "than the number of steps available (%d)\n",
                   stepStart, stepCount, nsteps);
            return -1;
        }

        start_t[0] = stepStart;
        count_t[0] = stepCount;
        nelems *= stepCount;
        if (verbose > 1)
            printf("    s[0]=%" PRIu64 ", c[0]=%" PRIu64 ", n=%" PRIu64 "\n", start_t[0],
                   count_t[0], nelems);
        tidx = 1;
    }

    tdims = ndim + tidx;

    // Absolute step is needed to access Shape of variable in a step
    // and also for StepSelection
    size_t absstep = relative_to_absolute_step(fp, variable, stepStart);

    // Get the shape of the variable for the starting step
    Dims shape;
    if (timestep)
    {
        shape = variable->Shape();
    }
    else
    {
        shape = variable->Shape(absstep);
    }
    if (verbose > 2)
    {
        printf("    starting step=%" PRIu64 " absolute step=%zu"
               ", dims={",
               stepStart, absstep);
        for (auto dim : shape)
        {
            printf("%zu", dim);
        }
        printf("}\n");
    }

    if (tidx)
    {
        // If shape is changing we still can support printing a single step
        auto dimsign = get_global_array_signature(fp, io, variable);
        bool changingShape = false;
        for (auto d : dimsign)
        {
            if (d == 0)
            {
                changingShape = true;
                break;
            }
        }
        if (changingShape && stepCount > 1)
        {
            printf("ERROR: This variable has a changing shape over time, "
                   "so bpls cannot dump it as a global array. \n");
            printf("You can dump a single step with\n"
                   "    bpls -d %s -s \"T",
                   variable->m_Name.c_str());
            for (j = 0; j < ndim; j++)
            {
                printf(",0");
            }
            printf("\" -c \"1");
            for (j = 0; j < ndim; j++)
            {
                printf(",-1");
            }
            printf("\"\nwhere T is a number between 0 and %d,\n", nsteps - 1);
            printf("or dump each block separately with \n"
                   "    bpls -dD %s\n",
                   variable->m_Name.c_str());
            return -1;
        }
    }

    for (j = 0; j < ndim; j++)
    {
        uint64_t st, ct;
        if (istart[j + tidx] < 0) // negative index means last-|index|
            st = shape[j] + istart[j + tidx];
        else
            st = istart[j + tidx];
        if (icount[j + tidx] < 0) // negative index means last-|index|+1-start
            ct = shape[j] + icount[j + tidx] + 1 - st;
        else
            ct = icount[j + tidx];

        if (verbose > 2)
            printf("    j=%d, st=%" PRIu64 " ct=%" PRIu64 "\n", j + tidx, st, ct);

        start_t[j + tidx] = st;
        count_t[j + tidx] = ct;
        nelems *= ct;
        if (verbose > 1)
            printf("    s[%d]=%" PRIu64 ", c[%d]=%" PRIu64 ", n=%" PRIu64 "\n", j + tidx,
                   start_t[j + tidx], j + tidx, count_t[j + tidx], nelems);
    }

    if (verbose > 1)
    {
        printf(" total size of data to read = %" PRIu64 "\n", nelems * elemsize);
    }

    print_slice_info(variable, (tidx == 1), start_t, count_t, shape);

    maxreadn = (uint64_t)MAX_BUFFERSIZE / elemsize;
    if (nelems < maxreadn)
        maxreadn = nelems;

    bool xmlprint = helper::EndsWith(variable->m_Name, ".xml", false);
    if (xmlprint && nelems > maxreadn)
        maxreadn = nelems;

    // special case: string. Need to use different elemsize
    /*if (vi->type == DataType::String)
    {
        if (vi->value)
            elemsize = strlen(vi->value) + 1;
        maxreadn = elemsize;
    }*/

    // allocate data array
    // data = (T *)malloc(maxreadn * elemsize);

    // determine strategy how to read in:
    //  - at once
    //  - loop over 1st dimension
    //  - loop over 1st & 2nd dimension
    //  - etc
    if (verbose > 1)
        printf("Read size strategy:\n");
    sum = (uint64_t)1;
    actualreadn = (uint64_t)1;
    for (i = tdims - 1; i >= 0; i--)
    {
        if (sum >= (uint64_t)maxreadn)
        {
            readn[i] = 1;
        }
        else
        {
            readn[i] = maxreadn / (int)sum; // sum is small for 4 bytes here
            // this may be over the max count for this dimension
            if (readn[i] > count_t[i])
                readn[i] = count_t[i];
        }
        if (verbose > 1)
            printf("    dim %d: read %" PRIu64 " elements\n", i, readn[i]);
        sum = sum * (uint64_t)count_t[i];
        actualreadn = actualreadn * readn[i];
    }
    if (verbose > 1)
        printf("    read %" PRIu64 " elements at once, %" PRIu64 " in total (nelems=%" PRIu64 ")\n",
               actualreadn, sum, nelems);

    // init s and c
    // and calculate ndigits_dims
    for (j = 0; j < tdims; j++)
    {
        s[j] = start_t[j];
        c[j] = readn[j];

        ndigits_dims[j] =
            ndigits(start_t[j] + count_t[j] - 1); // -1: dim=100 results in 2 digits (0..99)
    }

    // read until read all 'nelems' elements
    sum = 0;
    while (sum < nelems)
    {

        // how many elements do we read in next?
        actualreadn = 1;
        for (j = 0; j < tdims; j++)
            actualreadn *= c[j];

        if (verbose > 2)
        {
            printf("adios_read_var name=%s ", variable->m_Name.c_str());
            PRINT_DIMS_UINT64("  start", s, tdims, j);
            PRINT_DIMS_UINT64("  count", c, tdims, j);
            printf("  read %" PRIu64 " elems\n", actualreadn);
        }

        // read a slice finally
        const Dims startv = variable->m_ShapeID == ShapeID::GlobalArray
                                ? helper::Uint64ArrayToSizetVector(tdims - tidx, s + tidx)
                                : Dims();
        const Dims countv = variable->m_ShapeID == ShapeID::GlobalArray
                                ? helper::Uint64ArrayToSizetVector(tdims - tidx, c + tidx)
                                : Dims();

        if (verbose > 2)
        {
            printf("set selection: ");
            PRINT_DIMS_SIZET("  start", startv.data(), tdims - tidx, j);
            PRINT_DIMS_SIZET("  count", countv.data(), tdims - tidx, j);
            printf("\n");
        }

        if (variable->m_ShapeID == ShapeID::GlobalArray)
        {
            variable->SetSelection({startv, countv});
        }

        if (tidx)
        {
            if (verbose > 2)
            {
                printf("set Step selection: from relative step %" PRIu64 " read %" PRIu64
                       " steps\n",
                       s[0], c[0]);
            }
            variable->SetStepSelection({s[0], c[0]});
        }

        dataV.resize(variable->SelectionSize());
        fp->Get(*variable, dataV, adios2::Mode::Sync);

        // print slice
        print_dataset(dataV.data(), variable->m_Type, s, c, tdims, ndigits_dims);

        // prepare for next read
        sum += actualreadn;
        bool incdim = true; // last dim should be increased
        for (j = tdims - 1; j >= 0; j--)
        {
            if (incdim)
            {
                if (s[j] + c[j] == start_t[j] + count_t[j])
                {
                    // reached the end of this dimension
                    s[j] = start_t[j];
                    c[j] = readn[j];
                    incdim = true; // previous dim can increase too
                }
                else
                {
                    // move up in this dimension up to total count
                    s[j] += readn[j];
                    if (s[j] + c[j] > start_t[j] + count_t[j])
                    {
                        // do not reach over the limit
                        c[j] = start_t[j] + count_t[j] - s[j];
                    }
                    incdim = false;
                }
            }
        }
    } // end while sum < nelems
    print_endline();

    if (accuracyWasSet)
    {
        adios2::Accuracy a = variable->GetAccuracy();
        std::cout << "Read accuracy was (error = " << a.error << ", norm = " << a.norm << ", "
                  << (a.relative ? "rel" : "abs") << ")\n";
    }

    return 0;
}